

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_5d835d::Db::parseName(Db *this,NameState *State)

{
  char *pcVar1;
  BumpPointerAllocator *this_00;
  char cVar2;
  byte bVar3;
  int iVar4;
  short *psVar5;
  char *last;
  Node **ppNVar6;
  bool bVar7;
  Qualifiers QVar8;
  short *psVar9;
  char *pcVar10;
  NameType *pNVar11;
  byte *pbVar12;
  Node *pNVar13;
  Node *pNVar14;
  byte *pbVar15;
  Node *pNVar16;
  undefined8 *puVar17;
  ulong uVar18;
  long lVar19;
  byte *pbVar20;
  FunctionRefQual FVar21;
  undefined1 uVar22;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *this_01;
  Node *N;
  Node *local_48;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *local_40;
  Node *local_38;
  
  psVar9 = (short *)this->First;
  psVar5 = (short *)this->Last;
  if ((psVar9 != psVar5) && ((char)*psVar9 == 'L')) {
    psVar9 = (short *)((long)psVar9 + 1);
    this->First = (char *)psVar9;
  }
  uVar18 = (long)psVar5 - (long)psVar9;
  if (psVar5 != psVar9) {
    cVar2 = (char)*psVar9;
    if (cVar2 == 'Z') {
      this->First = (char *)((long)psVar9 + 1);
      pNVar14 = parseEncoding(this);
      if (pNVar14 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pcVar10 = this->First;
      last = this->Last;
      if (pcVar10 == last) {
        return (Node *)0x0;
      }
      if (*pcVar10 != 'E') {
        return (Node *)0x0;
      }
      pcVar1 = pcVar10 + 1;
      this->First = pcVar1;
      if (pcVar1 != last) {
        if (*pcVar1 == 'd') {
          this->First = pcVar10 + 2;
          parseNumber(this,true);
          pcVar10 = this->First;
          if (pcVar10 == this->Last) {
            return (Node *)0x0;
          }
          if (*pcVar10 != '_') {
            return (Node *)0x0;
          }
          this->First = pcVar10 + 1;
          pNVar11 = (NameType *)parseName(this,State);
          if (pNVar11 == (NameType *)0x0) {
            return (Node *)0x0;
          }
          goto LAB_001d414a;
        }
        if (*pcVar1 == 's') {
          this->First = pcVar10 + 2;
          pcVar10 = parse_discriminator(pcVar10 + 2,last);
          this->First = pcVar10;
          pNVar11 = (anonymous_namespace)::Db::
                    make<(anonymous_namespace)::NameType,char_const(&)[15]>
                              ((Db *)this,(char (*) [15])"string literal");
          goto LAB_001d414a;
        }
      }
      pNVar11 = (NameType *)parseName(this,State);
      if (pNVar11 == (NameType *)0x0) {
        return (Node *)0x0;
      }
      pcVar10 = parse_discriminator(this->First,this->Last);
      this->First = pcVar10;
LAB_001d414a:
      pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar13->K = KLocalName;
      pNVar13->RHSComponentCache = No;
      pNVar13->ArrayCache = No;
      pNVar13->FunctionCache = No;
      pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e4f0;
      pNVar13[1]._vptr_Node = (_func_int **)pNVar14;
      *(NameType **)&pNVar13[1].K = pNVar11;
      return pNVar13;
    }
    if (cVar2 == 'S') {
      if ((uVar18 < 2) || (*(char *)((long)psVar9 + 1) != 't')) {
        pNVar14 = parseSubstitution(this);
        if (pNVar14 == (Node *)0x0) {
          return (Node *)0x0;
        }
        if (this->Last == this->First) {
          return (Node *)0x0;
        }
        if (*this->First != 'I') {
          return (Node *)0x0;
        }
        pNVar13 = parseTemplateArgs(this,State != (NameState *)0x0);
        if (pNVar13 == (Node *)0x0) {
          return (Node *)0x0;
        }
        if (State != (NameState *)0x0) {
          State->EndsWithTemplateArgs = true;
        }
        pNVar16 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar16->K = KNameWithTemplateArgs;
        pNVar16->RHSComponentCache = No;
        pNVar16->ArrayCache = No;
        pNVar16->FunctionCache = No;
        pNVar16->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e650;
        pNVar16[1]._vptr_Node = (_func_int **)pNVar14;
        *(Node **)&pNVar16[1].K = pNVar13;
        return pNVar16;
      }
    }
    else if (cVar2 == 'N') {
      this->First = (char *)((long)psVar9 + 1);
      QVar8 = parseCVQualifiers(this);
      if (State != (NameState *)0x0) {
        State->CVQualifiers = QVar8;
      }
      psVar9 = (short *)this->First;
      psVar5 = (short *)this->Last;
      if (psVar9 == psVar5) {
LAB_001d3c73:
        if (State == (NameState *)0x0) goto LAB_001d3c8d;
        FVar21 = FrefQualNone;
      }
      else {
        if ((char)*psVar9 == 'R') {
          this->First = (char *)((long)psVar9 + 1);
          FVar21 = FrefQualLValue;
        }
        else {
          if ((char)*psVar9 != 'O') goto LAB_001d3c73;
          this->First = (char *)((long)psVar9 + 1);
          FVar21 = FrefQualRValue;
        }
        psVar9 = (short *)((long)psVar9 + 1);
        if (State == (NameState *)0x0) goto LAB_001d3c8d;
      }
      State->ReferenceQualifier = FVar21;
LAB_001d3c8d:
      local_48 = (Node *)0x0;
      if ((1 < (ulong)((long)psVar5 - (long)psVar9)) && (*psVar9 == 0x7453)) {
        this->First = (char *)(psVar9 + 1);
        local_48 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        local_48->K = KNameType;
        local_48->RHSComponentCache = No;
        local_48->ArrayCache = No;
        local_48->FunctionCache = No;
        local_48->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d6d8;
        local_48[1]._vptr_Node = (_func_int **)"std";
        *(char **)&local_48[1].K = "";
      }
      this_00 = &this->ASTAllocator;
      this_01 = &this->Subs;
      pNVar14 = local_48;
LAB_001d3cba:
      do {
        while( true ) {
          pbVar12 = (byte *)this->First;
          pbVar20 = (byte *)this->Last;
          while( true ) {
            if (pbVar12 != pbVar20) {
              if (*pbVar12 == 0x4c) {
                pbVar12 = pbVar12 + 1;
                this->First = (char *)pbVar12;
              }
              else if (*pbVar12 == 0x45) {
                this->First = (char *)(pbVar12 + 1);
                if (pNVar14 == (Node *)0x0) {
                  return (Node *)0x0;
                }
                ppNVar6 = (this->Subs).Last;
                if ((this->Subs).First == ppNVar6) {
                  return (Node *)0x0;
                }
                (this->Subs).Last = ppNVar6 + -1;
                return pNVar14;
              }
            }
            if (pbVar12 == pbVar20) goto LAB_001d3e99;
            bVar3 = *pbVar12;
            if (bVar3 != 0x4d) break;
            pbVar12 = pbVar12 + 1;
            this->First = (char *)pbVar12;
            if (pNVar14 == (Node *)0x0) {
              return (Node *)0x0;
            }
          }
          if (0x48 < bVar3) break;
          if (bVar3 != 0x43) {
            if (bVar3 != 0x44) goto LAB_001d3e99;
            if (1 < (ulong)((long)pbVar20 - (long)pbVar12)) {
              bVar3 = pbVar12[1];
              if (bVar3 == 0x43) goto LAB_001d3e99;
              if ((bVar3 == 0x74) || (bVar3 == 0x54)) {
                pNVar13 = parseDecltype(this);
                goto LAB_001d3ea4;
              }
            }
          }
          if (pNVar14 == (Node *)0x0) {
            return (Node *)0x0;
          }
          if ((pNVar14->K == KSpecialSubstitution) &&
             (iVar4 = *(int *)&pNVar14->field_0xc, iVar4 - 2U < 4)) {
            pNVar14 = (Node *)BumpPointerAllocator::allocate(this_00,0x10);
            pNVar14->K = KExpandedSpecialSubstitution;
            pNVar14->RHSComponentCache = No;
            pNVar14->ArrayCache = No;
            pNVar14->FunctionCache = No;
            pNVar14->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e2e0;
            *(int *)&pNVar14->field_0xc = iVar4;
            pbVar12 = (byte *)this->First;
            pbVar20 = (byte *)this->Last;
            local_48 = pNVar14;
          }
          if (pbVar12 == pbVar20) {
            return (Node *)0x0;
          }
          if (*pbVar12 == 0x43) {
            pbVar15 = pbVar12 + 1;
            this->First = (char *)pbVar15;
            if ((pbVar15 == pbVar20) || (*pbVar15 != 0x49)) {
              bVar7 = false;
            }
            else {
              pbVar15 = pbVar12 + 2;
              this->First = (char *)pbVar15;
              bVar7 = true;
            }
            if (pbVar20 == pbVar15) {
              return (Node *)0x0;
            }
            if ((2 < *pbVar15 - 0x31) && (*pbVar15 != 0x35)) {
              return (Node *)0x0;
            }
            this->First = (char *)(pbVar15 + 1);
            if (State != (NameState *)0x0) {
              State->CtorDtorConversion = true;
            }
            if (bVar7) {
              local_40 = this_01;
              pNVar13 = parseName(this,State);
              uVar22 = 0;
              if (pNVar13 == (Node *)0x0) {
                return (Node *)0x0;
              }
            }
            else {
              uVar22 = 0;
              local_40 = this_01;
            }
          }
          else {
            if ((ulong)((long)pbVar20 - (long)pbVar12) < 2) {
              return (Node *)0x0;
            }
            if (*pbVar12 != 0x44) {
              return (Node *)0x0;
            }
            if ((2 < pbVar12[1] - 0x30) && (pbVar12[1] != 0x35)) {
              return (Node *)0x0;
            }
            this->First = (char *)(pbVar12 + 2);
            uVar22 = 1;
            local_40 = this_01;
            if (State != (NameState *)0x0) {
              State->CtorDtorConversion = true;
            }
          }
          puVar17 = (undefined8 *)BumpPointerAllocator::allocate(this_00,0x20);
          *(undefined4 *)(puVar17 + 1) = 0x1010124;
          *puVar17 = &PTR_hasRHSComponentSlow_0023e338;
          puVar17[2] = pNVar14;
          *(undefined1 *)(puVar17 + 3) = uVar22;
          pNVar13 = (Node *)BumpPointerAllocator::allocate(this_00,0x20);
          pNVar13->K = KNestedName;
          pNVar13->RHSComponentCache = No;
          pNVar13->ArrayCache = No;
          pNVar13->FunctionCache = No;
          pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d788;
          pNVar13[1]._vptr_Node = (_func_int **)pNVar14;
          *(undefined8 **)&pNVar13[1].K = puVar17;
          if (State != (NameState *)0x0) {
            State->EndsWithTemplateArgs = false;
          }
          local_48 = parseAbiTags(this,pNVar13);
          this_01 = local_40;
          if (local_48 == (Node *)0x0) {
            return (Node *)0x0;
          }
LAB_001d4067:
          pNVar14 = local_48;
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(this_01,&local_48);
        }
        if (bVar3 != 0x49) {
          if (bVar3 == 0x53) {
            if (((ulong)((long)pbVar20 - (long)pbVar12) < 2) || (pbVar12[1] != 0x74)) {
              pNVar13 = parseSubstitution(this);
              if (pNVar13 == (Node *)0x0) {
                return (Node *)0x0;
              }
              pNVar16 = pNVar13;
              local_38 = pNVar13;
              if (pNVar14 != (Node *)0x0) {
                pNVar16 = (Node *)BumpPointerAllocator::allocate(this_00,0x20);
                pNVar16->K = KNestedName;
                pNVar16->RHSComponentCache = No;
                pNVar16->ArrayCache = No;
                pNVar16->FunctionCache = No;
                pNVar16->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d788;
                pNVar16[1]._vptr_Node = (_func_int **)pNVar14;
                *(Node **)&pNVar16[1].K = pNVar13;
              }
              if (State != (NameState *)0x0) {
                State->EndsWithTemplateArgs = false;
              }
              pNVar14 = pNVar16;
              local_48 = pNVar16;
              if (pNVar16 != pNVar13) {
                PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(this_01,&local_38);
              }
              goto LAB_001d3cba;
            }
LAB_001d3e99:
            pNVar13 = parseUnqualifiedName(this,State);
          }
          else {
            if (bVar3 != 0x54) goto LAB_001d3e99;
            pNVar13 = parseTemplateParam(this);
          }
LAB_001d3ea4:
          if (pNVar13 == (Node *)0x0) {
            return (Node *)0x0;
          }
          if (pNVar14 != (Node *)0x0) {
            pNVar16 = (Node *)BumpPointerAllocator::allocate(this_00,0x20);
            pNVar16->K = KNestedName;
            pNVar16->RHSComponentCache = No;
            pNVar16->ArrayCache = No;
            pNVar16->FunctionCache = No;
            pNVar16->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d788;
            pNVar16[1]._vptr_Node = (_func_int **)pNVar14;
            *(Node **)&pNVar16[1].K = pNVar13;
            pNVar13 = pNVar16;
          }
          local_48 = pNVar13;
          if (State != (NameState *)0x0) {
            State->EndsWithTemplateArgs = false;
          }
          goto LAB_001d4067;
        }
        pNVar13 = parseTemplateArgs(this,State != (NameState *)0x0);
        if (pNVar13 == (Node *)0x0) {
          return (Node *)0x0;
        }
        if (pNVar14 == (Node *)0x0) {
          return (Node *)0x0;
        }
        local_40 = this_01;
        pNVar16 = (Node *)BumpPointerAllocator::allocate(this_00,0x20);
        this_01 = local_40;
        pNVar16->K = KNameWithTemplateArgs;
        pNVar16->RHSComponentCache = No;
        pNVar16->ArrayCache = No;
        pNVar16->FunctionCache = No;
        pNVar16->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e650;
        pNVar16[1]._vptr_Node = (_func_int **)pNVar14;
        *(Node **)&pNVar16[1].K = pNVar13;
        if (State != (NameState *)0x0) {
          State->EndsWithTemplateArgs = true;
        }
        local_48 = pNVar16;
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(local_40,&local_48);
        pNVar14 = pNVar16;
      } while( true );
    }
  }
  if (uVar18 < 3) {
    if (uVar18 == 2) {
LAB_001d3a68:
      if (*psVar9 == 0x7453) {
        lVar19 = 2;
        goto LAB_001d3ba7;
      }
    }
    pNVar13 = parseUnqualifiedName(this,State);
    if (pNVar13 == (Node *)0x0) {
      return (Node *)0x0;
    }
  }
  else {
    if ((char)psVar9[1] != 'L' || *psVar9 != 0x7453) goto LAB_001d3a68;
    lVar19 = 3;
LAB_001d3ba7:
    this->First = (char *)((long)psVar9 + lVar19);
    pNVar14 = parseUnqualifiedName(this,State);
    if (pNVar14 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
    pNVar13->K = KStdQualifiedName;
    pNVar13->RHSComponentCache = No;
    pNVar13->ArrayCache = No;
    pNVar13->FunctionCache = No;
    pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e6a8;
    pNVar13[1]._vptr_Node = (_func_int **)pNVar14;
  }
  if (this->Last == this->First) {
    return pNVar13;
  }
  if (*this->First == 'I') {
    local_48 = pNVar13;
    PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,&local_48);
    pNVar14 = parseTemplateArgs(this,State != (NameState *)0x0);
    if (pNVar14 == (Node *)0x0) {
      return (Node *)0x0;
    }
    if (State != (NameState *)0x0) {
      State->EndsWithTemplateArgs = true;
    }
    pNVar16 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar16->K = KNameWithTemplateArgs;
    pNVar16->RHSComponentCache = No;
    pNVar16->ArrayCache = No;
    pNVar16->FunctionCache = No;
    pNVar16->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e650;
    pNVar16[1]._vptr_Node = (_func_int **)pNVar13;
    *(Node **)&pNVar16[1].K = pNVar14;
    return pNVar16;
  }
  return pNVar13;
}

Assistant:

Node *Db::parseName(NameState *State) {
  consumeIf('L'); // extension

  if (look() == 'N')
    return parseNestedName(State);
  if (look() == 'Z')
    return parseLocalName(State);

  //        ::= <unscoped-template-name> <template-args>
  if (look() == 'S' && look(1) != 't') {
    Node *S = parseSubstitution();
    if (S == nullptr)
      return nullptr;
    if (look() != 'I')
      return nullptr;
    Node *TA = parseTemplateArgs(State != nullptr);
    if (TA == nullptr)
      return nullptr;
    if (State) State->EndsWithTemplateArgs = true;
    return make<NameWithTemplateArgs>(S, TA);
  }

  Node *N = parseUnscopedName(State);
  if (N == nullptr)
    return nullptr;
  //        ::= <unscoped-template-name> <template-args>
  if (look() == 'I') {
    Subs.push_back(N);
    Node *TA = parseTemplateArgs(State != nullptr);
    if (TA == nullptr)
      return nullptr;
    if (State) State->EndsWithTemplateArgs = true;
    return make<NameWithTemplateArgs>(N, TA);
  }
  //        ::= <unscoped-name>
  return N;
}